

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPrsTrans.c
# Opt level: O0

int Psr_ManRangeSizeRange(Psr_Ntk_t *p,int Range)

{
  char *pcVar1;
  int local_34;
  int local_30;
  int Right;
  int Left;
  char *pStr;
  int Range_local;
  Psr_Ntk_t *p_local;
  
  if (Range == 0) {
    p_local._4_4_ = 1;
  }
  else {
    pcVar1 = Psr_NtkStr(p,Range);
    if (*pcVar1 != '[') {
      __assert_fail("pStr[0] == \'[\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bacPrsTrans.c"
                    ,0x96,"int Psr_ManRangeSizeRange(Psr_Ntk_t *, int)");
    }
    local_34 = atoi(pcVar1 + 1);
    pcVar1 = strstr(pcVar1,"=");
    local_30 = local_34;
    if (pcVar1 != (char *)0x0) {
      local_30 = atoi(pcVar1 + 1);
    }
    if (local_30 < local_34) {
      local_34 = local_34 - local_30;
    }
    else {
      local_34 = local_30 - local_34;
    }
    p_local._4_4_ = local_34 + 1;
  }
  return p_local._4_4_;
}

Assistant:

static inline int Psr_ManRangeSizeRange( Psr_Ntk_t * p, int Range )
{
    char * pStr; 
    int Left, Right;
    if ( Range == 0 ) 
        return 1;
    pStr = Psr_NtkStr( p, Range );
    assert( pStr[0] == '[' );
    Left = Right = atoi( pStr + 1 );
    pStr = strstr( pStr, "=" );
    if ( pStr )
        Right = atoi( pStr + 1 );
    return 1 + (Left > Right ? Left - Right : Right - Left);
}